

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

int __thiscall argo::json::operator_cast_to_int(json *this)

{
  long lVar1;
  json_exception *pjVar2;
  json *this_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    pjVar2 = (json_exception *)__cxa_allocate_exception(0xd8);
    json_exception::json_exception(pjVar2,cant_cast_raw_e);
    __cxa_throw(pjVar2,&json_exception::typeinfo,json_exception::~json_exception);
  }
  if (this->m_type == number_int_e) {
    this_local._4_4_ = (this->m_value).u_number_int;
  }
  else {
    if (this->m_type != number_double_e) {
      pjVar2 = (json_exception *)__cxa_allocate_exception(0xd8);
      json_exception::json_exception(pjVar2,not_number_e);
      __cxa_throw(pjVar2,&json_exception::typeinfo,json_exception::~json_exception);
    }
    this_local._4_4_ = (int)(this->m_value).u_number_double;
  }
  return this_local._4_4_;
}

Assistant:

json::operator int() const
{
    if (m_raw_value.size() > 0)
    {
        throw json_exception(json_exception::cant_cast_raw_e);
    }
    else if (m_type == number_int_e)
    {
        return m_value.u_number_int;
    }
    else if (m_type == number_double_e)
    {
        return static_cast<int>(m_value.u_number_double);
    }
    else
    {
        throw json_exception(json_exception::not_number_e);
    }
}